

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric::SetInertiasPerUnitLength
          (ChBeamSectionTimoshenkoAdvancedGeneric *this,double mJyy,double mJzz,double mJyz,
          double mQy,double mQz)

{
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy = mJyy;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz = mJzz;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz = mJyz;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.Jxx =
       mJyy + mJzz;
  this->Qy = mQy;
  this->Qz = mQz;
  return;
}

Assistant:

void ChBeamSectionTimoshenkoAdvancedGeneric::SetInertiasPerUnitLength(const double mJyy,
                                                                      const double mJzz,
                                                                      const double mJyz,
                                                                      const double mQy,
                                                                      const double mQz) {
    this->Jyy = mJyy;
    this->Jzz = mJzz;
    this->Jyz = mJyz;
    // automatically set parent Jxx value
    this->Jxx = (this->Jyy + this->Jzz);

    this->Qy = mQy;
    this->Qz = mQz;
}